

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptpubkey_p2pkh_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t flags,uchar *bytes_out,size_t len,
              size_t *written)

{
  int iVar1;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if ((flags < 3 && (bytes_len != 0 && bytes != (uchar *)0x0)) &&
     ((0x18 < len && written != (size_t *)0x0) && (bytes_out != (uchar *)0x0 && flags != 2))) {
    if (flags == 0) {
      if (bytes_len != 0x14) {
        return -2;
      }
    }
    else if ((bytes_len != 0x21) && (bytes_len != 0x41)) {
      return -2;
    }
    bytes_out[0] = 'v';
    bytes_out[1] = 0xa9;
    iVar1 = wally_script_push_from_bytes(bytes,bytes_len,flags,bytes_out + 2,len - 4,written);
    if (iVar1 == 0) {
      bytes_out[0x17] = 0x88;
      bytes_out[0x18] = 0xac;
      *written = 0x19;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_scriptpubkey_p2pkh_from_bytes(
    const unsigned char *bytes, size_t bytes_len,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    int ret;

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || !script_flags_ok(flags, 0) ||
        (flags & WALLY_SCRIPT_SHA256) || !bytes_out ||
        len < WALLY_SCRIPTPUBKEY_P2PKH_LEN || !written)
        return WALLY_EINVAL;

    if (flags & WALLY_SCRIPT_HASH160) {
        if (bytes_len != EC_PUBLIC_KEY_LEN && bytes_len != EC_PUBLIC_KEY_UNCOMPRESSED_LEN)
            return WALLY_EINVAL;
    } else if (bytes_len != HASH160_LEN)
        return WALLY_EINVAL;

    bytes_out[0] = OP_DUP;
    bytes_out[1] = OP_HASH160;
    ret = wally_script_push_from_bytes(bytes, bytes_len, flags,
                                       bytes_out + 2, len - 4, written);
    if (ret == WALLY_OK) {
        bytes_out[WALLY_SCRIPTPUBKEY_P2PKH_LEN - 2] = OP_EQUALVERIFY;
        bytes_out[WALLY_SCRIPTPUBKEY_P2PKH_LEN - 1] = OP_CHECKSIG;
        *written = WALLY_SCRIPTPUBKEY_P2PKH_LEN;
    }
    return ret;
}